

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O2

void LatencyDumpDefaultImpl::dumpRecursive(stringstream *ss,DumpItem *dump_item,size_t max_name_len)

{
  ostream *poVar1;
  LatencyItem *this;
  bool in_R9B;
  _List_node_base *p_Var2;
  string sStack_48;
  
  this = dump_item->itself;
  if (this != (LatencyItem *)0x0) {
    poVar1 = (ostream *)(ss + 0x10);
    if (dump_item->parent == (LatencyItem *)0x0) {
      dumpItem_abi_cxx11_(&sStack_48,(LatencyDumpDefaultImpl *)this,(LatencyItem *)max_name_len,0,1,
                          in_R9B);
      std::operator<<(poVar1,(string *)&sStack_48);
    }
    else {
      dumpItem_abi_cxx11_(&sStack_48,(LatencyDumpDefaultImpl *)this,(LatencyItem *)max_name_len,
                          (dump_item->parent->hist).sum.super___atomic_base<unsigned_long>._M_i,1,
                          in_R9B);
      std::operator<<(poVar1,(string *)&sStack_48);
    }
    std::__cxx11::string::~string((string *)&sStack_48);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  p_Var2 = (_List_node_base *)&dump_item->child;
  while (p_Var2 = (((_List_base<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&dump_item->child) {
    dumpRecursive(ss,(DumpItem *)p_Var2[1]._M_next,max_name_len);
  }
  return;
}

Assistant:

static void dumpRecursive(std::stringstream& ss,
                              DumpItem* dump_item,
                              size_t max_name_len) {
        if (dump_item->itself) {
            if (dump_item->parent) {
                ss << dumpItem(dump_item->itself, max_name_len,
                               dump_item->parent->getTotalTime());
            } else {
                ss << dumpItem(dump_item->itself, max_name_len);
            }
            ss << std::endl;
        }
        for (auto& entry : dump_item->child) {
            DumpItem* child = entry.get();
            dumpRecursive(ss, child, max_name_len);
        }
    }